

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O3

bool __thiscall JetHead::Path::append(Path *this,char *path)

{
  undefined1 uVar1;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,path,&local_31);
  uVar1 = JetHead::Path::append((string *)this);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return (bool)uVar1;
}

Assistant:

bool append( const char *path ) { return append( JHSTD::string( path ) ); }